

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int x9_62_init_key(ptls_key_exchange_algorithm_t *algo,ptls_key_exchange_context_t **_ctx,
                  EC_KEY *eckey)

{
  undefined8 in_RDX;
  undefined8 *in_RSI;
  int ret;
  st_x9_62_keyex_context_t *ctx;
  int local_24;
  
  local_24 = x9_62_create_context
                       ((ptls_key_exchange_algorithm_t *)eckey,(st_x9_62_keyex_context_t **)ctx);
  if ((local_24 == 0) &&
     (uRam0000000000000028 = in_RDX, local_24 = x9_62_setup_pubkey(ctx), local_24 == 0)) {
    local_24 = 0;
  }
  if (local_24 == 0) {
    *in_RSI = 0;
  }
  else {
    *in_RSI = 0;
  }
  return local_24;
}

Assistant:

static int x9_62_init_key(ptls_key_exchange_algorithm_t *algo, ptls_key_exchange_context_t **_ctx, EC_KEY *eckey)
{
    struct st_x9_62_keyex_context_t *ctx = NULL;
    int ret;

    if ((ret = x9_62_create_context(algo, &ctx)) != 0)
        goto Exit;
    ctx->privkey = eckey;
    if ((ret = x9_62_setup_pubkey(ctx)) != 0)
        goto Exit;
    ret = 0;

Exit:
    if (ret == 0) {
        *_ctx = &ctx->super;
    } else {
        if (ctx != NULL)
            x9_62_free_context(ctx);
        *_ctx = NULL;
    }
    return ret;
}